

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

ngram_model_t * ngram_model_set_interp(ngram_model_t *base,char **names,float32 *weights)

{
  char *__s1;
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (weights == (float32 *)0x0 || names == (char **)0x0) {
    if (weights != (float32 *)0x0) {
      memcpy(*(void **)&base[1].n,weights,(long)base[1].refcount << 2);
    }
  }
  else {
    uVar3 = (ulong)(uint)base[1].refcount;
    if (0 < base[1].refcount) {
      uVar4 = 0;
      do {
        uVar5 = 0;
        if (0 < (int)uVar3) {
          __s1 = names[uVar4];
          lVar1 = *(long *)&base[1].n_1g_alloc;
          uVar5 = 0;
          while (iVar2 = strcmp(__s1,*(char **)(lVar1 + uVar5 * 8)), iVar2 != 0) {
            uVar5 = uVar5 + 1;
            if ((uVar3 & 0xffffffff) == uVar5) goto LAB_0012f6ea;
          }
        }
        if ((int)uVar5 == (int)uVar3) {
LAB_0012f6ea:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                  ,0x1fd,"Unknown LM name %s\n",names[uVar4 & 0xffffffff]);
          return (ngram_model_t *)0x0;
        }
        iVar2 = logmath_log(base->lmath,(float64)(double)(float)weights[uVar4]);
        *(int *)(*(long *)&base[1].n + (uVar5 & 0xffffffff) * 4) = iVar2;
        uVar4 = uVar4 + 1;
        uVar3 = (ulong)base[1].refcount;
      } while ((long)uVar4 < (long)uVar3);
    }
  }
  *(undefined4 *)&base[1].field_0x4 = 0xffffffff;
  return base;
}

Assistant:

ngram_model_t *
ngram_model_set_interp(ngram_model_t * base,
                       const char **names, const float32 * weights)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;

    /* If we have a set of weights here, then set them. */
    if (names && weights) {
        int32 i, j;

        /* We hope there aren't many models. */
        for (i = 0; i < set->n_models; ++i) {
            for (j = 0; j < set->n_models; ++j)
                if (0 == strcmp(names[i], set->names[j]))
                    break;
            if (j == set->n_models) {
                E_ERROR("Unknown LM name %s\n", names[i]);
                return NULL;
            }
            set->lweights[j] = logmath_log(base->lmath, weights[i]);
        }
    }
    else if (weights) {
        memcpy(set->lweights, weights,
               set->n_models * sizeof(*set->lweights));
    }
    /* Otherwise just enable existing weights. */
    set->cur = -1;
    return base;
}